

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_add_between
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  REF_INT RVar1;
  REF_GEOM ref_geom;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  REF_STATUS ref_private_macro_code_rss;
  uint uVar8;
  undefined4 in_register_0000000c;
  REF_NODE pRVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  REF_INT RVar14;
  char *pcVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  REF_INT face_geom;
  REF_INT cell;
  REF_INT ncell;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT edge_geom;
  REF_BOOL supported;
  REF_INT cells [2];
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_INT nodes [27];
  uint local_1fc;
  undefined8 local_1f8;
  uint local_1ec;
  REF_DBL local_1e8;
  REF_DBL RStack_1e0;
  REF_NODE local_1d8;
  double local_1d0;
  int local_1c8;
  REF_INT local_1c4;
  double local_1c0;
  REF_DBL local_1b8;
  int local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  double local_1a0;
  double local_198;
  REF_DBL local_188;
  double dStack_180;
  undefined8 local_178;
  double local_170;
  double dStack_168;
  REF_DBL local_158;
  REF_DBL RStack_150;
  REF_DBL local_148 [4];
  REF_DBL local_128;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  ulong local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  REF_INT local_a8 [30];
  
  local_1f8 = CONCAT44(in_register_0000000c,new_node);
  ref_geom = ref_grid->geom;
  if ((node0 < 0) || (ref_geom->ref_adj->nnode <= node0)) {
    bVar16 = false;
  }
  else {
    bVar16 = ref_geom->ref_adj->first[(uint)node0] != -1;
  }
  if (node1 < 0) {
    return 0;
  }
  if (ref_geom->ref_adj->nnode <= node1) {
    return 0;
  }
  if (!(bool)(bVar16 & ref_geom->ref_adj->first[(uint)node1] != -1)) {
    return 0;
  }
  local_1d8 = ref_grid->node;
  local_118 = 1.0 - node1_weight;
  dStack_110 = 0.0;
  pRVar2 = ref_grid->cell[0];
  local_128 = node1_weight;
  local_a8[0] = node0;
  local_a8[1] = node1;
  uVar8 = ref_cell_with(pRVar2,local_a8,&local_1c4);
  if (uVar8 != 5) {
    if (uVar8 != 0) {
      pcVar15 = "search for edg";
      uVar10 = 0x4b9;
LAB_00127465:
      uVar13 = (ulong)uVar8;
      goto LAB_001275ae;
    }
    local_1ec = uVar8;
    uVar8 = ref_cell_nodes(pRVar2,local_1c4,local_a8);
    if (uVar8 == 0) {
      RVar1 = local_a8[pRVar2->node_per];
      uVar8 = ref_geom_cell_tuv(ref_geom,node0,local_a8,1,&local_f8,(REF_INT *)&local_1fc);
      if (uVar8 != 0) {
        pcVar15 = "cell uv";
        uVar10 = 0x4be;
        goto LAB_001274c6;
      }
      uVar8 = ref_geom_cell_tuv(ref_geom,node1,local_a8,1,&local_108,(REF_INT *)&local_1fc);
      if (uVar8 != 0) {
        uVar13 = (ulong)uVar8;
        pcVar15 = "cell uv";
        uVar10 = 0x4c0;
        goto LAB_001275ab;
      }
      local_1e8 = local_118 * local_f8 + local_108 * local_128;
      dStack_180 = dStack_110;
      local_158 = local_f8;
      local_1d0 = local_108;
      local_188 = local_1e8;
      if ((ref_geom->model != (void *)0x0) &&
         (uVar8 = ref_egads_inverse_eval
                            (ref_geom,1,RVar1,local_1d8->real + (int)local_1f8 * 0xf,&local_1e8),
         uVar8 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x4c5,"ref_geom_add_between",(ulong)uVar8,"inv eval edge");
        ref_geom_tec(ref_grid,"ref_geom_split_edge.tec");
        return uVar8;
      }
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_158;
      dVar23 = local_158;
      if (local_1d0 <= local_158) {
        dVar23 = local_1d0;
      }
      RVar14 = (REF_INT)local_1f8;
      if (local_1e8 < dVar23) {
LAB_00127beb:
        local_1e8 = local_188;
      }
      else {
        dVar18 = local_158;
        if (local_158 <= local_1d0) {
          dVar18 = local_1d0;
        }
        if (dVar18 < local_1e8) goto LAB_00127beb;
      }
      if (ref_geom->model != (void *)0x0) {
        local_1c0 = dVar23;
        uVar8 = ref_egads_eval_at(ref_geom,1,RVar1,&local_1e8,local_148,(REF_DBL *)0x0);
        if (uVar8 != 0) {
          uVar13 = (ulong)uVar8;
          pcVar15 = "eval";
          uVar10 = 0x4cf;
          goto LAB_001275ab;
        }
        pRVar4 = local_1d8->real;
        lVar11 = 0;
        do {
          (&local_178)[lVar11] = pRVar4[node0 * 0xf + lVar11] - local_148[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_e0 = (ulong)(uint)(node1 * 0xf);
        lVar11 = 0;
        do {
          (&local_1a8)[lVar11] = pRVar4[(ulong)(uint)(node1 * 0xf) + lVar11] - local_148[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        local_c8 = local_170;
        dStack_c0 = local_1a0;
        local_b8 = (double)CONCAT44(local_178._4_4_,(int)local_178);
        dStack_b0 = (double)CONCAT44(local_1a8._4_4_,(int)local_1a8);
        local_d8 = dStack_168;
        dStack_d0 = local_198;
        local_1b8 = local_188;
        uVar8 = ref_egads_eval_at(ref_geom,1,RVar1,&local_1b8,local_148,(REF_DBL *)0x0);
        if (uVar8 != 0) {
          pcVar15 = "eval";
          uVar10 = 0x4dd;
          goto LAB_001274c6;
        }
        auVar5._8_8_ = dStack_d0 * dStack_d0 + dStack_b0 * dStack_b0 + dStack_c0 * dStack_c0;
        auVar5._0_8_ = local_d8 * local_d8 + local_b8 * local_b8 + local_c8 * local_c8;
        auVar21 = sqrtpd(auVar21,auVar5);
        dVar19 = auVar21._0_8_;
        dVar18 = auVar21._8_8_ + dVar19;
        dVar23 = dVar18 * 1e+20;
        if (dVar23 <= -dVar23) {
          dVar23 = -dVar23;
        }
        dVar17 = dVar19;
        if (dVar19 <= -dVar19) {
          dVar17 = -dVar19;
        }
        pRVar4 = local_1d8->real;
        lVar11 = 0;
        do {
          (&local_178)[lVar11] = pRVar4[node0 * 0xf + lVar11] - local_148[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        lVar11 = 0;
        do {
          (&local_1a8)[lVar11] = pRVar4[local_e0 + lVar11] - local_148[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        auVar22._0_8_ = local_170 * local_170;
        auVar22._8_8_ = local_1a0 * local_1a0;
        auVar6._8_8_ = local_198 * local_198 +
                       (double)CONCAT44(local_1a8._4_4_,(int)local_1a8) *
                       (double)CONCAT44(local_1a8._4_4_,(int)local_1a8) + auVar22._8_8_;
        auVar6._0_8_ = dStack_168 * dStack_168 +
                       (double)CONCAT44(local_178._4_4_,(int)local_178) *
                       (double)CONCAT44(local_178._4_4_,(int)local_178) + auVar22._0_8_;
        auVar21 = sqrtpd(auVar22,auVar6);
        dVar20 = auVar21._0_8_;
        dVar24 = auVar21._8_8_ + dVar20;
        dVar25 = dVar24 * 1e+20;
        if (dVar25 <= -dVar25) {
          dVar25 = -dVar25;
        }
        dVar26 = dVar20;
        if (dVar20 <= -dVar20) {
          dVar26 = -dVar20;
        }
        auVar27._0_8_ =
             (double)(~-(ulong)(dVar26 < dVar25) & 0xbff0000000000000 |
                     (ulong)(dVar20 / dVar24) & -(ulong)(dVar26 < dVar25)) - local_128;
        auVar27._8_8_ =
             (double)(~-(ulong)(dVar17 < dVar23) & 0xbff0000000000000 |
                     (ulong)(dVar19 / dVar18) & -(ulong)(dVar17 < dVar23)) - local_128;
        auVar7._8_8_ = -auVar27._8_8_;
        auVar7._0_8_ = -auVar27._0_8_;
        auVar21 = maxpd(auVar27,auVar7);
        if (auVar21._0_8_ < auVar21._8_8_) {
          local_1e8 = local_1b8;
        }
        RVar14 = (REF_INT)local_1f8;
        dVar23 = local_1c0;
      }
      if (local_1e8 < dVar23) {
LAB_00127f7a:
        local_1e8 = local_188;
      }
      else {
        dVar23 = local_158;
        if (local_158 <= local_1d0) {
          dVar23 = local_1d0;
        }
        if (dVar23 < local_1e8) goto LAB_00127f7a;
      }
      uVar8 = ref_geom_add(ref_geom,RVar14,1,RVar1,&local_1e8);
      if (uVar8 != 0) {
        pcVar15 = "new geom";
        uVar10 = 0x4f2;
        goto LAB_001274c6;
      }
      uVar8 = ref_geom_find(ref_geom,(REF_INT)local_1f8,1,RVar1,(REF_INT *)&local_1a8);
      if (uVar8 == 0) goto LAB_0012747b;
      uVar13 = (ulong)uVar8;
      pcVar15 = "find the new edge for later face uv evaluation";
      uVar10 = 0x4f5;
    }
    else {
      uVar13 = (ulong)uVar8;
      pcVar15 = "get id";
      uVar10 = 0x4ba;
    }
LAB_001275ab:
    uVar8 = (uint)uVar13;
LAB_001275ae:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
           "ref_geom_add_between",uVar13,pcVar15);
    return uVar8;
  }
  local_1a8._0_4_ = -1;
  local_1ec = uVar8;
LAB_0012747b:
  pRVar2 = ref_grid->cell[3];
  uVar8 = ref_cell_list_with2(pRVar2,node0,node1,2,(REF_INT *)&local_1b8,(REF_INT *)local_148);
  if (uVar8 == 0) {
    if ((long)local_1b8._0_4_ == 0) {
      return 0;
    }
    if ((local_1b8._0_4_ != 2) && (ref_geom->manifold != 0)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x504,
             "ref_geom_add_between","expected two tri for between",2,(long)local_1b8._0_4_);
      ref_geom_tattle(ref_geom,node0);
      ref_geom_tattle(ref_geom,node1);
      pRVar9 = local_1d8;
      ref_node_location(local_1d8,node0);
      ref_node_location(pRVar9,node1);
      return 1;
    }
    if (0 < local_1b8._0_4_) {
      local_1d0 = (double)((long)(int)local_1a8 * 2);
      local_1c0 = (double)((long)(int)local_1a8 * 6 + 1);
      dStack_110 = local_118;
      local_158 = local_128;
      RStack_150 = local_128;
      pRVar9 = (REF_NODE)0x0;
      do {
        local_1c4 = *(REF_INT *)((long)local_148 + (long)pRVar9 * 4);
        local_1d8 = pRVar9;
        uVar8 = ref_cell_nodes(pRVar2,local_1c4,local_a8);
        if (uVar8 != 0) {
          pcVar15 = "get id";
          uVar10 = 0x508;
          goto LAB_001274c6;
        }
        uVar8 = ref_geom_tri_supported(ref_geom,local_a8,(REF_BOOL *)&local_178);
        if (uVar8 != 0) {
          uVar13 = (ulong)uVar8;
          pcVar15 = "tri support";
          uVar10 = 0x50a;
          goto LAB_001275ab;
        }
        if ((int)local_178 != 0) {
          local_188 = (REF_DBL)CONCAT44(local_188._4_4_,local_a8[pRVar2->node_per]);
          uVar8 = ref_geom_cell_tuv(ref_geom,node0,local_a8,2,&local_f8,(REF_INT *)&local_1fc);
          if (uVar8 != 0) {
            pcVar15 = "cell uv";
            uVar10 = 0x510;
            goto LAB_001274c6;
          }
          uVar8 = ref_geom_cell_tuv(ref_geom,node1,local_a8,2,&local_108,(REF_INT *)&local_1fc);
          if (uVar8 != 0) {
            uVar13 = (ulong)uVar8;
            pcVar15 = "cell uv";
            uVar10 = 0x512;
            goto LAB_001275ab;
          }
          local_1e8 = local_f8 * local_118 + local_108 * local_158;
          RStack_1e0 = dStack_f0 * dStack_110 + dStack_100 * RStack_150;
          RVar14 = (REF_INT)local_1f8;
          RVar1 = local_188._0_4_;
          uVar8 = ref_geom_add(ref_geom,RVar14,2,local_188._0_4_,&local_1e8);
          if (uVar8 != 0) {
            pcVar15 = "new geom";
            uVar10 = 0x516;
            goto LAB_00127465;
          }
          uVar8 = ref_geom_find(ref_geom,RVar14,2,RVar1,&local_1c8);
          if (uVar8 != 0) {
            pcVar15 = "new face geom";
            uVar10 = 0x518;
            goto LAB_001274c6;
          }
          uVar8 = ref_geom_find(ref_geom,node0,2,RVar1,&local_1ac);
          if (uVar8 != 0) {
            pcVar15 = "face geom";
            uVar10 = 0x51a;
            goto LAB_001274c6;
          }
          uVar8 = ref_geom_find(ref_geom,node1,2,RVar1,&local_1b0);
          if (uVar8 != 0) {
            uVar13 = (ulong)uVar8;
            pcVar15 = "face geom";
            uVar10 = 0x51b;
            goto LAB_001275ab;
          }
          pRVar3 = ref_geom->descr;
          iVar12 = pRVar3[(long)local_1ac * 6 + 3];
          if ((iVar12 != 0) && (iVar12 == pRVar3[(long)local_1b0 * 6 + 3])) {
            pRVar3[(long)local_1c8 * 6 + 3] = iVar12;
          }
          if ((local_1ec != 5) && (ref_geom->model != (void *)0x0)) {
            lVar11 = (long)local_1c8;
            iVar12 = local_1c8 * 2;
            local_1fc = (uint)(pRVar3[(long)(local_1c8 * 6) + 3] != 0);
            uVar8 = ref_egads_edge_face_uv
                              (ref_geom,pRVar3[(long)local_1c0],pRVar3[lVar11 * 6 + 1],local_1fc,
                               ref_geom->param[(long)local_1d0],&local_1e8);
            if (uVar8 != 0) {
              pcVar15 = "edge t param";
              uVar10 = 0x52c;
              goto LAB_00127465;
            }
            pRVar4 = ref_geom->param;
            pRVar4[lVar11 * 2] = local_1e8;
            pRVar4[iVar12 + 1] = RStack_1e0;
          }
        }
        pRVar9 = (REF_NODE)((long)&local_1d8->n + 1);
      } while ((long)pRVar9 < (long)local_1b8._0_4_);
    }
    if (local_1ec != 5) {
      return 0;
    }
    if (ref_geom->model == (void *)0x0) {
      return 0;
    }
    uVar8 = ref_geom_add_between_face_interior(ref_grid,node0,node1,local_128,(REF_INT)local_1f8);
    if (uVar8 == 0) {
      return 0;
    }
    pcVar15 = "position new node in uv";
    uVar10 = 0x535;
  }
  else {
    pcVar15 = "list";
    uVar10 = 0x4fa;
  }
LAB_001274c6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
         "ref_geom_add_between",(ulong)uVar8,pcVar15);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_between(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_DBL node1_weight,
                                        REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT edge_geom;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
    edge_geom = REF_EMPTY;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom))
      RSB(ref_egads_inverse_eval(ref_geom, type, id,
                                 ref_node_xyz_ptr(ref_node, new_node), param),
          "inv eval edge", ref_geom_tec(ref_grid, "ref_geom_split_edge.tec"));
    /* enforce bounding box and use midpoint as full-back */
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    if (ref_geom_model_loaded(ref_geom)) { /* check weight and distance ratio */
      REF_DBL xyz[3], dx0[3], dx1[3], d0, d1, total, actual_weight;
      REF_DBL mid_t, mid_weight;
      REF_INT ii;
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, param, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      actual_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        actual_weight = d0 / total;
      }
      mid_t = node0_weight * param0[0] + node1_weight * param1[0];
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_EDGE, id, &mid_t, xyz, NULL),
          "eval");
      for (ii = 0; ii < 3; ii++)
        dx0[ii] = ref_node_xyz(ref_node, ii, node0) - xyz[ii];
      for (ii = 0; ii < 3; ii++)
        dx1[ii] = ref_node_xyz(ref_node, ii, node1) - xyz[ii];
      d0 = sqrt(ref_math_dot(dx0, dx0));
      d1 = sqrt(ref_math_dot(dx1, dx1));
      total = d0 + d1;
      mid_weight = -1.0;
      if (ref_math_divisible(d0, total)) {
        mid_weight = d0 / total;
      }
      if (ABS(mid_weight - node1_weight) < ABS(actual_weight - node1_weight)) {
        /* printf("request %f actual %f mid %f\n",
                  node1_weight,actual_weight,mid_weight); */
        param[0] = mid_t;
      }
    }
    if (param[0] < MIN(param0[0], param1[0]) ||
        MAX(param0[0], param1[0]) < param[0])
      param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
    RSS(ref_geom_find(ref_geom, new_node, type, id, &edge_geom),
        "find the new edge for later face uv evaluation");
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }

    /* if there is an edge between, set the face uv based on edge t */
    if (ref_geom_model_loaded(ref_geom) && has_edge_support) {
      REF_INT faceid, edgeid;
      REF_DBL t;
      edgeid = ref_geom_id(ref_geom, edge_geom);
      faceid = ref_geom_id(ref_geom, face_geom);
      t = ref_geom_param(ref_geom, 0, edge_geom);
      sense = 0;
      if (0 != ref_geom_jump(ref_geom, face_geom)) sense = 1;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t, param),
          "edge t param");
      ref_geom_param(ref_geom, 0, face_geom) = param[0];
      ref_geom_param(ref_geom, 1, face_geom) = param[1];
    }
  }

  if (ref_geom_model_loaded(ref_geom) && !has_edge_support) {
    RSS(ref_geom_add_between_face_interior(ref_grid, node0, node1, node1_weight,
                                           new_node),
        "position new node in uv");
  }

  return REF_SUCCESS;
}